

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

ImVec4 ImPlot::GetAutoColor(ImPlotCol idx)

{
  float fVar1;
  ImVec4 *pIVar2;
  float *pfVar3;
  ImGuiCol idx_00;
  undefined8 uVar4;
  undefined8 uVar5;
  ImVec4 IVar6;
  
  uVar5 = 0x3f80000000000000;
  switch(idx) {
  case 4:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x13:
    goto switchD_002ff4c9_caseD_4;
  case 5:
    idx_00 = 7;
    break;
  case 6:
    idx_00 = 2;
    break;
  case 7:
    goto switchD_002ff4c9_caseD_7;
  case 8:
    idx_00 = 4;
    break;
  case 9:
  case 0x17:
    fVar1 = (GImPlot->Style).Colors[7].w;
    if ((fVar1 != -1.0) || (NAN(fVar1))) {
      uVar4._0_4_ = (GImPlot->Style).Colors[7].x;
      uVar4._4_4_ = (GImPlot->Style).Colors[7].y;
      uVar5._0_4_ = (GImPlot->Style).Colors[7].z;
      uVar5._4_4_ = (GImPlot->Style).Colors[7].w;
      goto LAB_002ff63e;
    }
    goto switchD_002ff4c9_caseD_7;
  case 10:
    fVar1 = (GImPlot->Style).Colors[0xc].w;
    if ((fVar1 != -1.0) || (NAN(fVar1))) {
      uVar4._0_4_ = (GImPlot->Style).Colors[0xc].x;
      uVar4._4_4_ = (GImPlot->Style).Colors[0xc].y;
      uVar5._0_4_ = (GImPlot->Style).Colors[0xc].z;
      uVar5._4_4_ = (GImPlot->Style).Colors[0xc].w;
      goto LAB_002ff63e;
    }
    goto switchD_002ff4c9_caseD_4;
  case 0xe:
    fVar1 = (GImPlot->Style).Colors[0xd].w;
    if ((fVar1 != -1.0) || (NAN(fVar1))) {
      pIVar2 = (GImPlot->Style).Colors + 0xd;
      pfVar3 = &(GImPlot->Style).Colors[0xd].z;
    }
    else {
LAB_002ff5be:
      pIVar2 = ImGui::GetStyleColorVec4(0);
      pfVar3 = &pIVar2->z;
    }
    goto LAB_002ff5cc;
  case 0x10:
    fVar1 = (GImPlot->Style).Colors[0xf].w;
    if ((fVar1 == -1.0) && (!NAN(fVar1))) goto LAB_002ff5be;
    pIVar2 = (GImPlot->Style).Colors + 0xf;
    pfVar3 = &(GImPlot->Style).Colors[0xf].z;
    goto LAB_002ff5cc;
  case 0x12:
    fVar1 = (GImPlot->Style).Colors[0x11].w;
    if ((fVar1 == -1.0) && (!NAN(fVar1))) goto LAB_002ff5be;
    pIVar2 = (GImPlot->Style).Colors + 0x11;
    pfVar3 = &(GImPlot->Style).Colors[0x11].z;
    goto LAB_002ff5cc;
  case 0x14:
    fVar1 = (GImPlot->Style).Colors[0x13].w;
    if ((fVar1 == -1.0) && (!NAN(fVar1))) goto LAB_002ff5be;
    pIVar2 = (GImPlot->Style).Colors + 0x13;
    pfVar3 = &(GImPlot->Style).Colors[0x13].z;
LAB_002ff5cc:
    uVar4._0_4_ = pIVar2->x;
    uVar4._4_4_ = pIVar2->y;
    uVar5 = CONCAT44((float)((ulong)*(undefined8 *)pfVar3 >> 0x20) * 0.25,(int)*(undefined8 *)pfVar3
                    );
    goto LAB_002ff63e;
  case 0x15:
    uVar4 = 0x3f8000003f800000;
    goto LAB_002ff63e;
  case 0x16:
    uVar4 = 0x3f80000000000000;
    uVar5 = 0x3f80000000000000;
    goto LAB_002ff63e;
  default:
    uVar4 = 0;
    goto LAB_002ff63e;
  }
LAB_002ff630:
  pIVar2 = ImGui::GetStyleColorVec4(idx_00);
  uVar4._0_4_ = pIVar2->x;
  uVar4._4_4_ = pIVar2->y;
  uVar5._0_4_ = pIVar2->z;
  uVar5._4_4_ = pIVar2->w;
LAB_002ff63e:
  IVar6.z = (float)(int)uVar5;
  IVar6.w = (float)(int)((ulong)uVar5 >> 0x20);
  IVar6.x = (float)(int)uVar4;
  IVar6.y = (float)(int)((ulong)uVar4 >> 0x20);
  return IVar6;
switchD_002ff4c9_caseD_7:
  idx_00 = 5;
  goto LAB_002ff630;
switchD_002ff4c9_caseD_4:
  idx_00 = 0;
  goto LAB_002ff630;
}

Assistant:

ImVec4 GetAutoColor(ImPlotCol idx) {
    ImVec4 col(0,0,0,1);
    switch(idx) {
        case ImPlotCol_Line:          return col; // these are plot dependent!
        case ImPlotCol_Fill:          return col; // these are plot dependent!
        case ImPlotCol_MarkerOutline: return col; // these are plot dependent!
        case ImPlotCol_MarkerFill:    return col; // these are plot dependent!
        case ImPlotCol_ErrorBar:      return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_FrameBg:       return ImGui::GetStyleColorVec4(ImGuiCol_FrameBg);
        case ImPlotCol_PlotBg:        return ImGui::GetStyleColorVec4(ImGuiCol_WindowBg);
        case ImPlotCol_PlotBorder:    return ImGui::GetStyleColorVec4(ImGuiCol_Border);
        case ImPlotCol_LegendBg:      return ImGui::GetStyleColorVec4(ImGuiCol_PopupBg);
        case ImPlotCol_LegendBorder:  return GetStyleColorVec4(ImPlotCol_PlotBorder);
        case ImPlotCol_LegendText:    return GetStyleColorVec4(ImPlotCol_InlayText);
        case ImPlotCol_TitleText:     return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_InlayText:     return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_XAxis:         return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_XAxisGrid:     return GetStyleColorVec4(ImPlotCol_XAxis) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_YAxis:         return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_YAxisGrid:     return GetStyleColorVec4(ImPlotCol_YAxis) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_YAxis2:        return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_YAxisGrid2:    return GetStyleColorVec4(ImPlotCol_YAxis2) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_YAxis3:        return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_YAxisGrid3:    return GetStyleColorVec4(ImPlotCol_YAxis3) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_Selection:     return ImVec4(1,1,0,1);
        case ImPlotCol_Query:         return ImVec4(0,1,0,1);
        case ImPlotCol_Crosshairs:    return GetStyleColorVec4(ImPlotCol_PlotBorder);
        default: return col;
    }
}